

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O1

void Cnf_ManTransferCuts(Cnf_Man_t *p)

{
  Aig_Obj_t *pObj;
  Vec_Ptr_t *pVVar1;
  Cnf_Cut_t *pCVar2;
  long lVar3;
  
  Aig_MmFlexRestart(p->pMemCuts);
  pVVar1 = p->pManAig->vObjs;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      pObj = (Aig_Obj_t *)pVVar1->pArray[lVar3];
      if (pObj != (Aig_Obj_t *)0x0) {
        if ((*(ulong *)&pObj->field_0x18 & 0xffffffc0) == 0) {
          pCVar2 = (Cnf_Cut_t *)0x0;
        }
        else {
          pCVar2 = (Cnf_Cut_t *)0x0;
          if (0xfffffffd < ((uint)*(ulong *)&pObj->field_0x18 & 7) - 7) {
            pCVar2 = Cnf_CutCreate(p,pObj);
          }
        }
        (pObj->field_5).pData = pCVar2;
      }
      lVar3 = lVar3 + 1;
      pVVar1 = p->pManAig->vObjs;
    } while (lVar3 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Cnf_ManTransferCuts( Cnf_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_MmFlexRestart( p->pMemCuts );
    Aig_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) && pObj->nRefs > 0 )
            pObj->pData = Cnf_CutCreate( p, pObj );
        else
            pObj->pData = NULL;
    }
}